

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O2

void prvTidyCheckHTML5(TidyDocImpl *doc,Node *node)

{
  int iVar1;
  int iVar2;
  TidyTagId TVar3;
  Dict *pDVar4;
  Bool BVar5;
  Node *pNVar6;
  AttVal *pAVar7;
  char *property;
  long lVar8;
  
  iVar1 = *(int *)((doc->config).value + 0x30);
  iVar2 = *(int *)((doc->config).value + 0x51);
  pNVar6 = prvTidyFindBody(doc);
  do {
    if (node == (Node *)0x0) {
      return;
    }
    pAVar7 = (AttVal *)&node->attributes;
    do {
      pAVar7 = pAVar7->next;
      if (pAVar7 == (AttVal *)0x0) goto LAB_00156855;
    } while ((pAVar7->dict == (Attribute *)0x0) || (pAVar7->dict->id != TidyAttr_ALIGN));
    if (iVar2 == 0) {
      pAVar7 = prvTidyAttrGetById(node,TidyAttr_ALIGN);
      prvTidyReportAttrError(doc,node,pAVar7,0x255);
    }
LAB_00156855:
    if (node == pNVar6) {
      if (iVar2 == 0) {
        for (lVar8 = 0; lVar8 != 0x18; lVar8 = lVar8 + 4) {
          pAVar7 = prvTidyAttrGetById(node,*(TidyAttrId *)((long)BadBody5Attribs + lVar8));
          if (pAVar7 != (AttVal *)0x0) {
            prvTidyReportAttrError(doc,node,pAVar7,0x255);
          }
        }
      }
    }
    else if (node->tag == (Dict *)0x0) {
LAB_00156927:
      BVar5 = prvTidynodeIsElement(node);
      if ((BVar5 != no) && (pDVar4 = node->tag, pDVar4 != (Dict *)0x0)) {
        if ((pDVar4->versions & 0x6e000) == 0) goto LAB_001569dc;
        BVar5 = inRemovedInfo(pDVar4->id);
        if (BVar5 == no || iVar2 != 0) goto LAB_001569f6;
        goto LAB_001569e1;
      }
    }
    else {
      TVar3 = node->tag->id;
      if (1 < TVar3 - TidyTag_FRAME) {
        if (TVar3 == TidyTag_TT) {
          if (iVar1 != 0) {
            property = "font-family: monospace";
            goto LAB_001569c1;
          }
        }
        else if (TVar3 == TidyTag_APPLET) {
          if (iVar1 != 0) {
            TVar3 = TidyTag_OBJECT;
LAB_001569ce:
            prvTidyCoerceNode(doc,node,TVar3,yes,no);
            goto LAB_001569f6;
          }
        }
        else if (TVar3 != TidyTag_BASEFONT) {
          if (TVar3 == TidyTag_BIG) {
            if (iVar1 != 0) {
              property = "font-size: larger";
LAB_001569c1:
              prvTidyAddStyleProperty(doc,node,property);
              TVar3 = TidyTag_SPAN;
              goto LAB_001569ce;
            }
          }
          else if ((((TVar3 != TidyTag_CENTER) && (TVar3 != TidyTag_DIR)) && (TVar3 != TidyTag_FONT)
                   ) && (TVar3 != TidyTag_NOFRAMES)) {
            if (TVar3 == TidyTag_STRIKE) {
              if (iVar1 != 0) {
                property = "text-decoration: line-through";
                goto LAB_001569c1;
              }
            }
            else {
              if (TVar3 != TidyTag_ACRONYM) goto LAB_00156927;
              if (iVar1 != 0) {
                TVar3 = TidyTag_ABBR;
                goto LAB_001569ce;
              }
            }
          }
        }
      }
LAB_001569dc:
      if (iVar2 == 0) {
LAB_001569e1:
        prvTidyReport(doc,node,node,0x271);
      }
    }
LAB_001569f6:
    if (node->content != (Node *)0x0) {
      prvTidyCheckHTML5(doc,node->content);
    }
    node = node->next;
  } while( true );
}

Assistant:

void TY_(CheckHTML5)( TidyDocImpl* doc, Node* node )
{
    Bool clean = cfgBool( doc, TidyMakeClean );
    Bool already_strict = cfgBool( doc, TidyStrictTagsAttr );
    Node* body = TY_(FindBody)( doc );
    Bool warn = yes;    /* should this be a warning, error, or report??? */
    AttVal* attr = NULL;
    int i = 0;

    while (node)
    {
        if ( nodeHasAlignAttr( node ) ) {
            /* @todo: Is this for ALL elements that accept an 'align' attribute,
             * or should this be a sub-set test?
             */

            /* We will only emit this message if `--strict-tags-attributes==no`;
             * otherwise if yes this message will be output during later
             * checking.
             */
            if ( !already_strict )
                TY_(ReportAttrError)(doc, node, TY_(AttrGetById)(node, TidyAttr_ALIGN), MISMATCHED_ATTRIBUTE_WARN);
        }
        if ( node == body ) {
            i = 0;
            /* We will only emit these messages if `--strict-tags-attributes==no`;
             * otherwise if yes these messages will be output during later
             * checking.
             */
            if ( !already_strict ) {
                while ( BadBody5Attribs[i] != TidyAttr_UNKNOWN ) {
                    attr = TY_(AttrGetById)(node, BadBody5Attribs[i]);
                    if ( attr )
                        TY_(ReportAttrError)(doc, node, attr , MISMATCHED_ATTRIBUTE_WARN);
                    i++;
                }
            }
        } else
        if ( nodeIsACRONYM(node) ) {
            if (clean) {
                /* Replace with 'abbr' with warning to that effect.
                 * Maybe should use static void RenameElem( TidyDocImpl* doc, Node* node, TidyTagId tid )
                 */
                TY_(CoerceNode)(doc, node, TidyTag_ABBR, warn, no);
            } else {
                if ( !already_strict )
                    TY_(Report)(doc, node, node, REMOVED_HTML5);
            }
        } else
        if ( nodeIsAPPLET(node) ) {
            if (clean) {
                /* replace with 'object' with warning to that effect
                 * maybe should use static void RenameElem( TidyDocImpl* doc, Node* node, TidyTagId tid )
                 */
                TY_(CoerceNode)(doc, node, TidyTag_OBJECT, warn, no);
            } else {
                if ( !already_strict )
                    TY_(Report)(doc, node, node, REMOVED_HTML5);
            }
        } else
        if ( nodeIsBASEFONT(node) ) {
            /* basefont: CSS equivalent 'font-size', 'font-family' and 'color' 
             * on body or class on each subsequent element.
             * Difficult - If it is the first body element, then could consider
             * adding that to the <body> as a whole, else could perhaps apply it
             * to all subsequent elements. But also in consideration is the fact
             * that it was NOT supported in many browsers.
             * - For now just report a warning
             */
            if ( !already_strict )
                TY_(Report)(doc, node, node, REMOVED_HTML5);
        } else
        if ( nodeIsBIG(node) ) {
            /* big: CSS equivalent 'font-size:larger'
             * so could replace the <big> ... </big> with
             * <span style="font-size: larger"> ... </span>
             * then replace <big> with <span>
             * Need to think about that...
             * Could use -
             *   TY_(AddStyleProperty)( doc, node, "font-size: larger" );
             *   TY_(CoerceNode)(doc, node, TidyTag_SPAN, no, no);
             * Alternatively generated a <style> but how to get the style name
             * TY_(AddAttribute)( doc, node, "class", "????" );
             * Also maybe need a specific message like
             * Element '%s' replaced with 'span' with a 'font-size: larger style attribute
             * maybe should use static void RenameElem( TidyDocImpl* doc, Node* node, TidyTagId tid )
             */
            if (clean) {
                TY_(AddStyleProperty)( doc, node, "font-size: larger" );
                TY_(CoerceNode)(doc, node, TidyTag_SPAN, warn, no);
            } else {
                if ( !already_strict )
                    TY_(Report)(doc, node, node, REMOVED_HTML5);
            }
        } else
        if ( nodeIsCENTER(node) ) {
            /* center: CSS equivalent 'text-align:center'
             * and 'margin-left:auto; margin-right:auto' on descendant blocks
             * Tidy already handles this if 'clean' by SILENTLY generating the
             * <style> and adding a <div class="c1"> around the elements.
             * see: static Bool Center2Div( TidyDocImpl* doc, Node *node, Node **pnode)
             */
            if ( !already_strict )
                TY_(Report)(doc, node, node, REMOVED_HTML5);
        } else
        if ( nodeIsDIR(node) ) {
            /* dir: replace by <ul>
             * Tidy already actions this and issues a warning
             * Should this be CHANGED???
             */
            if ( !already_strict )
                TY_(Report)(doc, node, node, REMOVED_HTML5);
        } else
        if ( nodeIsFONT(node) ) {
            /* Tidy already handles this -
             * If 'clean' replaced by CSS, else
             * if is NOT clean, and doctype html5 then warnings issued
             * done in Bool Font2Span( TidyDocImpl* doc, Node *node, Node **pnode ) (I think?)
             */
            if ( !already_strict )
                TY_(Report)(doc, node, node, REMOVED_HTML5);
        } else
        if (( nodesIsFRAME(node) ) || ( nodeIsFRAMESET(node) ) || ( nodeIsNOFRAMES(node) )) {
            /* YOW: What to do here?????? Maybe <iframe>????
             */
            if ( !already_strict )
                TY_(Report)(doc, node, node, REMOVED_HTML5);
        } else
        if ( nodeIsSTRIKE(node) ) {
            /* strike: CSS equivalent 'text-decoration:line-through'
             * maybe should use static void RenameElem( TidyDocImpl* doc, Node* node, TidyTagId tid )
             */
            if (clean) {
                TY_(AddStyleProperty)( doc, node, "text-decoration: line-through" );
                TY_(CoerceNode)(doc, node, TidyTag_SPAN, warn, no);
            } else {
                if ( !already_strict )
                    TY_(Report)(doc, node, node, REMOVED_HTML5);
            }
        } else
        if ( nodeIsTT(node) ) {
            /* tt: CSS equivalent 'font-family:monospace'
             * Tidy presently does nothing. Tidy5 issues a warning
             * But like the 'clean' <font> replacement this could also be replaced with CSS
             * maybe should use static void RenameElem( TidyDocImpl* doc, Node* node, TidyTagId tid )
             */
            if (clean) {
                TY_(AddStyleProperty)( doc, node, "font-family: monospace" );
                TY_(CoerceNode)(doc, node, TidyTag_SPAN, warn, no);
            } else {
                if ( !already_strict )
                    TY_(Report)(doc, node, node, REMOVED_HTML5);
            }
        } else
            if (TY_(nodeIsElement)(node)) {
                if (node->tag) {
                    if ( (!(node->tag->versions & VERS_HTML5) && !(node->tag->versions & VERS_PROPRIETARY)) || (inRemovedInfo(node->tag->id)) ) {
                        if ( !already_strict )
                            TY_(Report)(doc, node, node, REMOVED_HTML5);
                    }
                }
            }

        if (node->content)
            TY_(CheckHTML5)( doc, node->content );
        
        node = node->next;
    }
}